

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O0

BOOL DBG_init_channels(void)

{
  char cVar1;
  FILE *__stream;
  int iVar2;
  uint __errnum;
  char *pcVar3;
  char *pcVar4;
  char *__s;
  bool bVar5;
  uint local_40;
  int ret;
  DWORD flag_mask;
  CHAR plus_or_minus;
  LPSTR level_ptr;
  LPSTR entry_ptr;
  LPSTR env_pcache;
  LPSTR env_workstring;
  LPCSTR env_string;
  INT i;
  
  local_40 = 0;
  InternalInitializeCriticalSection(&fprintf_crit_section);
  for (env_string._0_4_ = 0; (int)env_string < 0x17; env_string._0_4_ = (int)env_string + 1) {
    dbg_channel_flags[(int)env_string] = 0x10;
  }
  pcVar3 = MiscGetenv("PAL_DBG_CHANNELS");
  if (pcVar3 == (char *)0x0) {
    env_pcache = (LPSTR)0x0;
    pcVar3 = env_pcache;
  }
  else {
    env_pcache = PAL__strdup(pcVar3);
    pcVar3 = env_pcache;
    if (env_pcache == (char *)0x0) {
      DeleteCriticalSection(&fprintf_crit_section);
      return 0;
    }
  }
LAB_001549e1:
  do {
    if (env_pcache == (LPSTR)0x0) {
LAB_00154c85:
      PAL_free(pcVar3);
      pcVar3 = MiscGetenv("PAL_API_TRACING");
      if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
        output_file = (FILE *)_stderr;
      }
      else {
        iVar2 = strcmp(pcVar3,"stderr");
        if (iVar2 == 0) {
          output_file = (FILE *)_stderr;
        }
        else {
          iVar2 = strcmp(pcVar3,"stdout");
          if (iVar2 == 0) {
            output_file = _stdout;
          }
          else {
            output_file = (FILE *)fopen64(pcVar3,"at");
            if ((FILE *)output_file == (FILE *)0x0) {
              output_file = (FILE *)_stderr;
              fprintf(_stderr,
                      "Can\'t open %s for writing : debug messages will go to stderr. Check your PAL_API_TRACING variable!\n"
                      ,pcVar3);
            }
          }
        }
      }
      pcVar3 = MiscGetenv("PAL_DISABLE_ASSERTS");
      if ((pcVar3 == (char *)0x0) || (iVar2 = strcmp(pcVar3,"1"), iVar2 != 0)) {
        g_Dbg_asserts_enabled = 1;
      }
      else {
        g_Dbg_asserts_enabled = 0;
      }
      pcVar3 = MiscGetenv("PAL_API_LEVELS");
      if (pcVar3 == (char *)0x0) {
        max_entry_level = 1;
      }
      else {
        max_entry_level = atoi(pcVar3);
      }
      if ((max_entry_level == 0) ||
         (__errnum = pthread_key_create(&entry_level_key,(__destr_function *)0x0),
         __stream = _stderr, __errnum == 0)) {
        env_string._4_4_ = 1;
      }
      else {
        pcVar3 = strerror(__errnum);
        fprintf(__stream,"ERROR : pthread_key_create() failed error:%d (%s)\n",(ulong)__errnum,
                pcVar3);
        DeleteCriticalSection(&fprintf_crit_section);
        env_string._4_4_ = 0;
      }
      return env_string._4_4_;
    }
    level_ptr = env_pcache;
    while( true ) {
      bVar5 = false;
      if ((*level_ptr != '\0') && (bVar5 = false, *level_ptr != '+')) {
        bVar5 = *level_ptr != '-';
      }
      if (!bVar5) break;
      level_ptr = level_ptr + 1;
    }
    if (*level_ptr == '\0') goto LAB_00154c85;
    __s = level_ptr + 1;
    cVar1 = *level_ptr;
    pcVar4 = strchr(__s,0x3a);
    env_pcache = pcVar4;
    if (pcVar4 != (char *)0x0) {
      env_pcache = pcVar4 + 1;
      *pcVar4 = '\0';
    }
    pcVar4 = strchr(__s,0x2e);
  } while (pcVar4 == (char *)0x0);
  *pcVar4 = '\0';
  iVar2 = strcmp(pcVar4 + 1,"all");
  if (iVar2 == 0) {
    if (cVar1 == '+') {
      local_40 = 0xffff;
    }
    else {
      local_40 = 0;
    }
  }
  else {
    for (env_string._0_4_ = 0; (int)env_string < 6; env_string._0_4_ = (int)env_string + 1) {
      iVar2 = strcmp(pcVar4 + 1,dbg_level_names[(int)env_string]);
      if (iVar2 == 0) {
        if (cVar1 == '+') {
          local_40 = 1 << ((byte)(int)env_string & 0x1f);
        }
        else {
          local_40 = 1 << ((byte)(int)env_string & 0x1f) ^ 0xffffffff;
        }
        break;
      }
    }
    if ((int)env_string == 6) goto LAB_001549e1;
  }
  if ((local_40 & 1) == 0) {
    local_40 = local_40 & 0xffffffdf;
  }
  else {
    local_40 = local_40 | 0x20;
  }
  iVar2 = strcmp(__s,"all");
  if (iVar2 == 0) {
    if (cVar1 == '+') {
      for (env_string._0_4_ = 0; (int)env_string < 0x17; env_string._0_4_ = (int)env_string + 1) {
        dbg_channel_flags[(int)env_string] = local_40 | dbg_channel_flags[(int)env_string];
      }
    }
    else {
      for (env_string._0_4_ = 0; (int)env_string < 0x17; env_string._0_4_ = (int)env_string + 1) {
        dbg_channel_flags[(int)env_string] = local_40 & dbg_channel_flags[(int)env_string];
      }
    }
  }
  else {
    for (env_string._0_4_ = 0; (int)env_string < 0x17; env_string._0_4_ = (int)env_string + 1) {
      iVar2 = strcmp(__s,dbg_channel_names[(int)env_string]);
      if (iVar2 == 0) {
        if (cVar1 == '+') {
          dbg_channel_flags[(int)env_string] = local_40 | dbg_channel_flags[(int)env_string];
        }
        else {
          dbg_channel_flags[(int)env_string] = local_40 & dbg_channel_flags[(int)env_string];
        }
        break;
      }
    }
  }
  goto LAB_001549e1;
}

Assistant:

BOOL DBG_init_channels(void)
{
    INT i;
    LPCSTR env_string;
    LPSTR env_workstring;
    LPSTR env_pcache;
    LPSTR entry_ptr;
    LPSTR level_ptr;
    CHAR plus_or_minus;
    DWORD flag_mask = 0;
    int ret;

    InternalInitializeCriticalSection(&fprintf_crit_section);

    /* output only asserts by default [only affects no-vararg-support case; if
       we have varargs, these flags aren't even checked for ASSERTs] */
    for(i=0;i<DCI_LAST;i++)
        dbg_channel_flags[i]=1<<DLI_ASSERT;

    /* parse PAL_DBG_CHANNELS environment variable */

    if (!(env_string = MiscGetenv(ENV_CHANNELS)))
    {
        env_pcache = env_workstring = NULL;
    }
    else
    {
        env_pcache = env_workstring = PAL__strdup(env_string);

        if (env_workstring == NULL)
        {
            /* Not enough memory */
            DeleteCriticalSection(&fprintf_crit_section);
            return FALSE;
        }
    }
    while(env_workstring)
    {
        entry_ptr=env_workstring;

        /* find beginning of next entry */
        while((*entry_ptr != '\0') &&(*entry_ptr != '+') && (*entry_ptr != '-'))
        {
            entry_ptr++;
        }

        /* break if end of string is reached */
        if(*entry_ptr == '\0')
        {
           break;
        }

        plus_or_minus=*entry_ptr++;

        /* find end of entry; if strchr returns NULL, we have reached the end
           of the string and we will leave the loop at the end of this pass. */
        env_workstring=strchr(entry_ptr,':');

        /* NULL-terminate entry, make env_string point to rest of string */
        if(env_workstring)
        {
            *env_workstring++='\0';
        }

        /* find period that separates channel name from level name */
        level_ptr=strchr(entry_ptr,'.');

        /* an entry with no period is illegal : ignore it */
        if(!level_ptr)
        {
            continue;
        }
        /* NULL-terminate channel name, make level_ptr point to the level name */
        *level_ptr++='\0';

        /* build the flag mask based on requested level */

        /* if "all" level is specified, we want to open/close all levels at
           once, so mask is either all ones or all zeroes */
        if(!strcmp(level_ptr,"all"))
        {
            if(plus_or_minus=='+')
            {
                flag_mask=0xFFFF;  /* OR this to open all levels */
            }
            else
            {
                flag_mask=0;       /* AND this to close all levels*/
            }
        }
        else
        {
            for(i=0;i<DLI_LAST;i++)
            {
                if(!strcmp(level_ptr,dbg_level_names[i]))
                {
                    if(plus_or_minus=='+')
                    {
                        flag_mask=1<<i;     /* OR this to open the level */
                    }
                    else
                    {
                        flag_mask=~(1<<i);  /* AND this to close the level */
                    }
                    break;
                }
            }
            /* didn't find a matching level : skip it. */
            if(i==DLI_LAST)
            {
                continue;
            }
        }

        /* Set EXIT and ENTRY channels to be identical */
        if(!(flag_mask & (1<<DLI_ENTRY)))
        {
            flag_mask = flag_mask & (~(1<<DLI_EXIT));
        }
        else
        {
            flag_mask = flag_mask | (1<<DLI_EXIT);
        }

        /* apply the flag mask to the specified channel */

        /* if "all" channel is specified, apply mask to all channels */
        if(!strcmp(entry_ptr,"all"))
        {
            if(plus_or_minus=='+')
            {
                for(i=0;i<DCI_LAST;i++)
                {
                    dbg_channel_flags[i] |= flag_mask; /* OR to open levels*/
                }
            }
            else
            {
                for(i=0;i<DCI_LAST;i++)
                {
                    dbg_channel_flags[i] &= flag_mask; /* AND to close levels */
                }
            }
        }
        else
        {
            for(i=0;i<DCI_LAST;i++)
            {
                if(!strcmp(entry_ptr,dbg_channel_names[i]))
                {
                    if(plus_or_minus=='+')
                    {
                        dbg_channel_flags[i] |= flag_mask;
                    }
                    else
                    {
                        dbg_channel_flags[i] &= flag_mask;
                    }

                    break;
                }
            }
            /* ignore the entry if the channel name is unknown */
        }
        /* done processing this entry; on to the next. */
    }
    PAL_free(env_pcache);

    /* select output file */
    env_string=MiscGetenv(ENV_FILE);
    if(env_string && *env_string!='\0')
    {
        if(!strcmp(env_string, "stderr"))
        {
            output_file = stderr;
        }
        else if(!strcmp(env_string, "stdout"))
        {
            output_file = stdout;
        }
        else
        {
            output_file = fopen(env_string,FOPEN_FLAGS);

            /* if file can't be opened, default to stderr */
            if(!output_file)
            {
                output_file = stderr;
                fprintf(stderr, "Can't open %s for writing : debug messages "
                        "will go to stderr. Check your PAL_API_TRACING "
                        "variable!\n", env_string);
            }
        }
    }
    else
    {
        output_file = stderr; /* output to stderr by default */
    }

    /* see if we need to disable assertions */
    env_string = MiscGetenv(ENV_ASSERTS);
    if(env_string && 0 == strcmp(env_string,"1"))
    {
        g_Dbg_asserts_enabled = FALSE;
    }
    else
    {
        g_Dbg_asserts_enabled = TRUE;
    }

    /* select ENTRY level limitation */
    env_string = MiscGetenv(ENV_ENTRY_LEVELS);
    if(env_string)
    {
        max_entry_level = atoi(env_string);
    }
    else
    {
        max_entry_level = 1;
    }

    /* if necessary, allocate TLS key for entry nesting level */
    if(0 != max_entry_level)
    {
        if ((ret = pthread_key_create(&entry_level_key,NULL)) != 0)
        {
            fprintf(stderr, "ERROR : pthread_key_create() failed error:%d (%s)\n",
                   ret, strerror(ret));
            DeleteCriticalSection(&fprintf_crit_section);;
            return FALSE;
        }
    }

    return TRUE;
}